

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql_statement.hpp
# Opt level: O3

void __thiscall duckdb::AttachStatement::AttachStatement(AttachStatement *this)

{
  (this->super_SQLStatement).type = ATTACH_STATEMENT;
  (this->super_SQLStatement).stmt_location = 0;
  (this->super_SQLStatement).stmt_length = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_buckets =
       &(this->super_SQLStatement).named_param_map._M_h._M_single_bucket;
  (this->super_SQLStatement).named_param_map._M_h._M_bucket_count = 1;
  (this->super_SQLStatement).named_param_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_SQLStatement).named_param_map._M_h._M_element_count = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_SQLStatement).query._M_dataplus._M_p =
       (pointer)&(this->super_SQLStatement).query.field_2;
  (this->super_SQLStatement).query._M_string_length = 0;
  (this->super_SQLStatement).query.field_2._M_local_buf[0] = '\0';
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__AttachStatement_0243b830;
  (this->info).super_unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AttachInfo_*,_std::default_delete<duckdb::AttachInfo>_>.
  super__Head_base<0UL,_duckdb::AttachInfo_*,_false>._M_head_impl = (AttachInfo *)0x0;
  return;
}

Assistant:

explicit SQLStatement(StatementType type) : type(type) {
	}